

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexedBWT.h
# Opt level: O3

void __thiscall
bwtil::IndexedBWT::IndexedBWT(IndexedBWT *this,string *BWT,ulint sample_rate,bool verbose)

{
  uint64_t *puVar1;
  pointer pcVar2;
  pointer puVar3;
  pointer puVar4;
  pointer psVar5;
  ulong uVar6;
  pointer puVar7;
  uint uVar8;
  int iVar9;
  ulint uVar10;
  ostream *poVar11;
  pointer puVar12;
  long lVar13;
  pointer __s;
  long lVar14;
  uint64_t uVar15;
  unsigned_long uVar16;
  undefined8 uVar17;
  uchar *puVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  byte bVar22;
  pointer puVar23;
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 extraout_var [56];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar29 [16];
  undefined1 in_ZMM1 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar30 [16];
  undefined1 in_ZMM2 [64];
  reference rVar31;
  vector<unsigned_char,_std::allocator<unsigned_char>_> alphabet;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  uint local_f0;
  uint local_ec;
  undefined1 local_e8 [40];
  pointer puStack_c0;
  pointer local_b8;
  undefined1 local_b0 [16];
  pointer local_a0;
  uint64_t local_98;
  uint16_t local_90;
  vector<bool,_std::allocator<bool>_> local_88;
  ulint local_60;
  undefined1 local_58 [16];
  pointer local_48;
  
  auVar30 = in_ZMM2._0_16_;
  auVar29 = in_ZMM1._0_16_;
  (this->bwt_wt).nodes.
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bwt_wt).nodes.
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bwt_wt).nodes.
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->marked_positions).n = 0;
  (this->marked_positions).bitvector.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->marked_positions).bitvector.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->marked_positions).bitvector.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->marked_positions).rank_ptrs_1.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->marked_positions).rank_ptrs_1.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->marked_positions).rank_ptrs_1.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->marked_positions).rank_ptrs_2.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->marked_positions).bitvector.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 2) = 0;
  *(undefined8 *)
   ((long)&(this->marked_positions).rank_ptrs_1.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start + 2) = 0;
  *(undefined8 *)
   ((long)&(this->marked_positions).rank_ptrs_1.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->marked_positions).rank_ptrs_1.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 2) = 0;
  *(undefined8 *)
   ((long)&(this->marked_positions).rank_ptrs_2.
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start + 2) = 0;
  *(undefined8 *)
   ((long)&(this->marked_positions).rank_ptrs_2.
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->marked_positions).rank_ptrs_2.
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 2) = 0;
  *(undefined8 *)((long)&(this->marked_positions).global_rank1 + 2) = 0;
  (this->text_pointers)._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->text_pointers)._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->text_pointers)._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->text_pointers)._size = 0;
  (this->text_pointers)._width = 0;
  (this->text_pointers)._field_mask = 0;
  (this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->inverse_remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inverse_remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->inverse_remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar20 = BWT->_M_string_length;
  this->n = uVar20;
  this->offrate = sample_rate;
  if (sample_rate == 0) {
    uVar10 = 0;
  }
  else {
    uVar10 = uVar20 / sample_rate + 1;
  }
  this->number_of_SA_pointers = uVar10;
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," Building indexed BWT data structure",0x24);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  Number of sampled SA pointers = ",0x22);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    auVar26._8_56_ = extraout_var_00;
    auVar26._0_8_ = extraout_XMM1_Qa;
    auVar29 = auVar26._0_16_;
    uVar20 = this->n;
  }
  auVar29 = vcvtusi2sd_avx512f(auVar29,uVar20);
  auVar24._0_8_ = log2(auVar29._0_8_);
  auVar24._8_56_ = extraout_var;
  auVar29 = vroundsd_avx(auVar24._0_16_,auVar24._0_16_,10);
  iVar9 = vcvttsd2usi_avx512f(auVar29);
  this->w = iVar9 + (uint)(iVar9 == 0);
  puVar12 = (pointer)operator_new(0x100);
  puVar12[0xc0] = '\0';
  puVar12[0xc1] = '\0';
  puVar12[0xc2] = '\0';
  puVar12[0xc3] = '\0';
  puVar12[0xc4] = '\0';
  puVar12[0xc5] = '\0';
  puVar12[0xc6] = '\0';
  puVar12[199] = '\0';
  puVar12[200] = '\0';
  puVar12[0xc9] = '\0';
  puVar12[0xca] = '\0';
  puVar12[0xcb] = '\0';
  puVar12[0xcc] = '\0';
  puVar12[0xcd] = '\0';
  puVar12[0xce] = '\0';
  puVar12[0xcf] = '\0';
  puVar12[0xd0] = '\0';
  puVar12[0xd1] = '\0';
  puVar12[0xd2] = '\0';
  puVar12[0xd3] = '\0';
  puVar12[0xd4] = '\0';
  puVar12[0xd5] = '\0';
  puVar12[0xd6] = '\0';
  puVar12[0xd7] = '\0';
  puVar12[0xd8] = '\0';
  puVar12[0xd9] = '\0';
  puVar12[0xda] = '\0';
  puVar12[0xdb] = '\0';
  puVar12[0xdc] = '\0';
  puVar12[0xdd] = '\0';
  puVar12[0xde] = '\0';
  puVar12[0xdf] = '\0';
  puVar12[0xe0] = '\0';
  puVar12[0xe1] = '\0';
  puVar12[0xe2] = '\0';
  puVar12[0xe3] = '\0';
  puVar12[0xe4] = '\0';
  puVar12[0xe5] = '\0';
  puVar12[0xe6] = '\0';
  puVar12[0xe7] = '\0';
  puVar12[0xe8] = '\0';
  puVar12[0xe9] = '\0';
  puVar12[0xea] = '\0';
  puVar12[0xeb] = '\0';
  puVar12[0xec] = '\0';
  puVar12[0xed] = '\0';
  puVar12[0xee] = '\0';
  puVar12[0xef] = '\0';
  puVar12[0xf0] = '\0';
  puVar12[0xf1] = '\0';
  puVar12[0xf2] = '\0';
  puVar12[0xf3] = '\0';
  puVar12[0xf4] = '\0';
  puVar12[0xf5] = '\0';
  puVar12[0xf6] = '\0';
  puVar12[0xf7] = '\0';
  puVar12[0xf8] = '\0';
  puVar12[0xf9] = '\0';
  puVar12[0xfa] = '\0';
  puVar12[0xfb] = '\0';
  puVar12[0xfc] = '\0';
  puVar12[0xfd] = '\0';
  puVar12[0xfe] = '\0';
  puVar12[0xff] = '\0';
  puVar12[0x80] = '\0';
  puVar12[0x81] = '\0';
  puVar12[0x82] = '\0';
  puVar12[0x83] = '\0';
  puVar12[0x84] = '\0';
  puVar12[0x85] = '\0';
  puVar12[0x86] = '\0';
  puVar12[0x87] = '\0';
  puVar12[0x88] = '\0';
  puVar12[0x89] = '\0';
  puVar12[0x8a] = '\0';
  puVar12[0x8b] = '\0';
  puVar12[0x8c] = '\0';
  puVar12[0x8d] = '\0';
  puVar12[0x8e] = '\0';
  puVar12[0x8f] = '\0';
  puVar12[0x90] = '\0';
  puVar12[0x91] = '\0';
  puVar12[0x92] = '\0';
  puVar12[0x93] = '\0';
  puVar12[0x94] = '\0';
  puVar12[0x95] = '\0';
  puVar12[0x96] = '\0';
  puVar12[0x97] = '\0';
  puVar12[0x98] = '\0';
  puVar12[0x99] = '\0';
  puVar12[0x9a] = '\0';
  puVar12[0x9b] = '\0';
  puVar12[0x9c] = '\0';
  puVar12[0x9d] = '\0';
  puVar12[0x9e] = '\0';
  puVar12[0x9f] = '\0';
  puVar12[0xa0] = '\0';
  puVar12[0xa1] = '\0';
  puVar12[0xa2] = '\0';
  puVar12[0xa3] = '\0';
  puVar12[0xa4] = '\0';
  puVar12[0xa5] = '\0';
  puVar12[0xa6] = '\0';
  puVar12[0xa7] = '\0';
  puVar12[0xa8] = '\0';
  puVar12[0xa9] = '\0';
  puVar12[0xaa] = '\0';
  puVar12[0xab] = '\0';
  puVar12[0xac] = '\0';
  puVar12[0xad] = '\0';
  puVar12[0xae] = '\0';
  puVar12[0xaf] = '\0';
  puVar12[0xb0] = '\0';
  puVar12[0xb1] = '\0';
  puVar12[0xb2] = '\0';
  puVar12[0xb3] = '\0';
  puVar12[0xb4] = '\0';
  puVar12[0xb5] = '\0';
  puVar12[0xb6] = '\0';
  puVar12[0xb7] = '\0';
  puVar12[0xb8] = '\0';
  puVar12[0xb9] = '\0';
  puVar12[0xba] = '\0';
  puVar12[0xbb] = '\0';
  puVar12[0xbc] = '\0';
  puVar12[0xbd] = '\0';
  puVar12[0xbe] = '\0';
  puVar12[0xbf] = '\0';
  puVar12[0x40] = '\0';
  puVar12[0x41] = '\0';
  puVar12[0x42] = '\0';
  puVar12[0x43] = '\0';
  puVar12[0x44] = '\0';
  puVar12[0x45] = '\0';
  puVar12[0x46] = '\0';
  puVar12[0x47] = '\0';
  puVar12[0x48] = '\0';
  puVar12[0x49] = '\0';
  puVar12[0x4a] = '\0';
  puVar12[0x4b] = '\0';
  puVar12[0x4c] = '\0';
  puVar12[0x4d] = '\0';
  puVar12[0x4e] = '\0';
  puVar12[0x4f] = '\0';
  puVar12[0x50] = '\0';
  puVar12[0x51] = '\0';
  puVar12[0x52] = '\0';
  puVar12[0x53] = '\0';
  puVar12[0x54] = '\0';
  puVar12[0x55] = '\0';
  puVar12[0x56] = '\0';
  puVar12[0x57] = '\0';
  puVar12[0x58] = '\0';
  puVar12[0x59] = '\0';
  puVar12[0x5a] = '\0';
  puVar12[0x5b] = '\0';
  puVar12[0x5c] = '\0';
  puVar12[0x5d] = '\0';
  puVar12[0x5e] = '\0';
  puVar12[0x5f] = '\0';
  puVar12[0x60] = '\0';
  puVar12[0x61] = '\0';
  puVar12[0x62] = '\0';
  puVar12[99] = '\0';
  puVar12[100] = '\0';
  puVar12[0x65] = '\0';
  puVar12[0x66] = '\0';
  puVar12[0x67] = '\0';
  puVar12[0x68] = '\0';
  puVar12[0x69] = '\0';
  puVar12[0x6a] = '\0';
  puVar12[0x6b] = '\0';
  puVar12[0x6c] = '\0';
  puVar12[0x6d] = '\0';
  puVar12[0x6e] = '\0';
  puVar12[0x6f] = '\0';
  puVar12[0x70] = '\0';
  puVar12[0x71] = '\0';
  puVar12[0x72] = '\0';
  puVar12[0x73] = '\0';
  puVar12[0x74] = '\0';
  puVar12[0x75] = '\0';
  puVar12[0x76] = '\0';
  puVar12[0x77] = '\0';
  puVar12[0x78] = '\0';
  puVar12[0x79] = '\0';
  puVar12[0x7a] = '\0';
  puVar12[0x7b] = '\0';
  puVar12[0x7c] = '\0';
  puVar12[0x7d] = '\0';
  puVar12[0x7e] = '\0';
  puVar12[0x7f] = '\0';
  puVar12[0] = '\0';
  puVar12[1] = '\0';
  puVar12[2] = '\0';
  puVar12[3] = '\0';
  puVar12[4] = '\0';
  puVar12[5] = '\0';
  puVar12[6] = '\0';
  puVar12[7] = '\0';
  puVar12[8] = '\0';
  puVar12[9] = '\0';
  puVar12[10] = '\0';
  puVar12[0xb] = '\0';
  puVar12[0xc] = '\0';
  puVar12[0xd] = '\0';
  puVar12[0xe] = '\0';
  puVar12[0xf] = '\0';
  puVar12[0x10] = '\0';
  puVar12[0x11] = '\0';
  puVar12[0x12] = '\0';
  puVar12[0x13] = '\0';
  puVar12[0x14] = '\0';
  puVar12[0x15] = '\0';
  puVar12[0x16] = '\0';
  puVar12[0x17] = '\0';
  puVar12[0x18] = '\0';
  puVar12[0x19] = '\0';
  puVar12[0x1a] = '\0';
  puVar12[0x1b] = '\0';
  puVar12[0x1c] = '\0';
  puVar12[0x1d] = '\0';
  puVar12[0x1e] = '\0';
  puVar12[0x1f] = '\0';
  puVar12[0x20] = '\0';
  puVar12[0x21] = '\0';
  puVar12[0x22] = '\0';
  puVar12[0x23] = '\0';
  puVar12[0x24] = '\0';
  puVar12[0x25] = '\0';
  puVar12[0x26] = '\0';
  puVar12[0x27] = '\0';
  puVar12[0x28] = '\0';
  puVar12[0x29] = '\0';
  puVar12[0x2a] = '\0';
  puVar12[0x2b] = '\0';
  puVar12[0x2c] = '\0';
  puVar12[0x2d] = '\0';
  puVar12[0x2e] = '\0';
  puVar12[0x2f] = '\0';
  puVar12[0x30] = '\0';
  puVar12[0x31] = '\0';
  puVar12[0x32] = '\0';
  puVar12[0x33] = '\0';
  puVar12[0x34] = '\0';
  puVar12[0x35] = '\0';
  puVar12[0x36] = '\0';
  puVar12[0x37] = '\0';
  puVar12[0x38] = '\0';
  puVar12[0x39] = '\0';
  puVar12[0x3a] = '\0';
  puVar12[0x3b] = '\0';
  puVar12[0x3c] = '\0';
  puVar12[0x3d] = '\0';
  puVar12[0x3e] = '\0';
  puVar12[0x3f] = '\0';
  puVar23 = (this->remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start;
  (this->remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = puVar12;
  (this->remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar12 + 0x100;
  (this->remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar12 + 0x100;
  if (puVar23 != (pointer)0x0) {
    operator_delete(puVar23);
  }
  local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uchar *)0x0;
  local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uchar *)0x0;
  local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (uchar *)0x0;
  local_e8[0] = false;
  auVar26 = ZEXT1664(auVar30);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_88,0x100,(bool *)local_e8,(allocator_type *)local_58);
  local_60 = sample_rate;
  if (this->n != 0) {
    puVar23 = (uchar *)0x0;
    lVar13 = 0;
    do {
      if ((uchar *)BWT->_M_string_length <= puVar23) {
        std::__throw_out_of_range_fmt
                  ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",puVar23);
        goto LAB_00104c3f;
      }
      if ((ulong)puVar23[(long)(BWT->_M_dataplus)._M_p] == 0) {
        this->terminator_position = (ulint)puVar23;
        lVar13 = lVar13 + 1;
      }
      else {
        rVar31 = std::vector<bool,_std::allocator<bool>_>::at
                           (&local_88,(ulong)puVar23[(long)(BWT->_M_dataplus)._M_p]);
        if ((*rVar31._M_p & rVar31._M_mask) == 0) {
          if ((uchar *)BWT->_M_string_length <= puVar23) goto LAB_00104c6c;
          local_e8[0] = puVar23[(long)(BWT->_M_dataplus)._M_p];
          if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
            _M_realloc_insert<unsigned_char>
                      (&local_108,
                       (iterator)
                       local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish,local_e8);
          }
          else {
            *local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish = local_e8[0];
            local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          if ((uchar *)BWT->_M_string_length <= puVar23) goto LAB_00104c7d;
          rVar31 = std::vector<bool,_std::allocator<bool>_>::at
                             (&local_88,(ulong)puVar23[(long)(BWT->_M_dataplus)._M_p]);
          *rVar31._M_p = *rVar31._M_p | rVar31._M_mask;
        }
      }
      puVar7 = local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar12 = local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar23 = puVar23 + 1;
    } while (puVar23 < (uchar *)this->n);
    if (lVar13 == 1) {
      lVar13 = (long)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      this->sigma = (uint)lVar13;
      if (lVar13 != 0) {
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(int)LZCOUNT(lVar13) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (puVar12,puVar7);
      }
      puVar23 = local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar20 = 0;
        do {
          (this->remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start
          [local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[uVar20]] = (uchar)uVar20;
          uVar20 = (ulong)((int)uVar20 + 1);
        } while (uVar20 < (ulong)((long)local_108.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_108.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start));
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e8,
                 (ulong)this->sigma,(allocator_type *)local_58);
      puVar12 = (this->inverse_remapping).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      (this->inverse_remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT71(local_e8._1_7_,local_e8[0]);
      (this->inverse_remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_e8._8_8_;
      (this->inverse_remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_e8._16_8_;
      local_e8[0] = false;
      local_e8._1_7_ = 0;
      local_e8._8_8_ = (pointer)0x0;
      local_e8._16_8_ = (pointer)0x0;
      if (puVar12 != (pointer)0x0) {
        operator_delete(puVar12);
        if ((void *)CONCAT71(local_e8._1_7_,local_e8[0]) != (void *)0x0) {
          operator_delete((void *)CONCAT71(local_e8._1_7_,local_e8[0]));
        }
      }
      if (this->sigma != 0) {
        uVar20 = 0;
        do {
          if ((ulong)((long)local_108.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_108.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start) <= uVar20) goto LAB_00104c3f;
          (this->inverse_remapping).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar20] =
               local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start[uVar20];
          uVar20 = uVar20 + 1;
        } while (uVar20 < this->sigma);
      }
      if (this->n != 0) {
        uVar20 = 0;
        do {
          if (BWT->_M_string_length <= uVar20) goto LAB_00104c4d;
          pcVar2 = (BWT->_M_dataplus)._M_p;
          pcVar2[uVar20] =
               (this->remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start[(byte)pcVar2[uVar20]];
          uVar20 = uVar20 + 1;
        } while (uVar20 < this->n);
      }
      WaveletTree::WaveletTree((WaveletTree *)local_e8,BWT,verbose);
      puVar23 = (uchar *)0x0;
      (this->bwt_wt).n = CONCAT71(local_e8._1_7_,local_e8[0]);
      local_48 = (this->bwt_wt).nodes.
                 super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->bwt_wt).nodes.
      super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_e8._24_8_;
      local_58._0_8_ =
           (this->bwt_wt).nodes.
           super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_58._8_8_ =
           (this->bwt_wt).nodes.
           super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (this->bwt_wt).nodes.
      super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_e8._8_8_;
      (this->bwt_wt).nodes.
      super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_e8._16_8_;
      local_e8._8_8_ = (pointer)0x0;
      local_e8._24_8_ = (pointer)0x0;
      local_e8._16_8_ = SUB168(ZEXT816(0),4);
      std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::~vector
                ((vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> *)
                 local_58);
      auVar29 = stack0xffffffffffffff38;
      (this->bwt_wt).sigma = local_e8._32_4_;
      (this->bwt_wt).log_sigma = local_e8._36_4_;
      (this->bwt_wt).number_of_nodes = (ulint)puStack_c0;
      unique0x10003545 = auVar29;
      std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::~vector
                ((vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> *)
                 (local_e8 + 8));
      (this->marked_positions).n = 0;
      (this->marked_positions).bitvector.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      puVar3 = (this->marked_positions).bitvector.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->marked_positions).bitvector.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this->marked_positions).bitvector.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3);
      }
      puVar3 = (this->marked_positions).rank_ptrs_1.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->marked_positions).rank_ptrs_1.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (this->marked_positions).rank_ptrs_1.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this->marked_positions).rank_ptrs_1.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3);
      }
      puVar4 = (this->marked_positions).rank_ptrs_2.
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->marked_positions).rank_ptrs_2.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (this->marked_positions).rank_ptrs_2.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this->marked_positions).rank_ptrs_2.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (puVar4 != (pointer)0x0) {
        operator_delete(puVar4);
      }
      (this->marked_positions).local_rank1 = 0;
      (this->marked_positions).global_rank1 = 0;
      bv::internal::packed_view<std::vector>::packed_view
                ((packed_view<std::vector> *)local_e8,(ulong)this->w,this->number_of_SA_pointers);
      puVar3 = (this->text_pointers)._bits._container.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->text_pointers)._bits._container.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)CONCAT71(local_e8._1_7_,local_e8[0]);
      (this->text_pointers)._bits._container.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_e8._8_8_;
      (this->text_pointers)._bits._container.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_e8._16_8_;
      local_e8[0] = false;
      local_e8._1_7_ = 0;
      local_e8._8_8_ = SUB168(ZEXT816(0),4);
      local_e8._16_8_ = (pointer)0x0;
      local_f0 = (uint)verbose;
      if (puVar3 == (pointer)0x0) {
        (this->text_pointers)._field_mask = (word_type)puStack_c0;
        (this->text_pointers)._size = local_e8._24_8_;
        (this->text_pointers)._width = local_e8._32_8_;
      }
      else {
        operator_delete(puVar3);
        (this->text_pointers)._field_mask = (word_type)puStack_c0;
        (this->text_pointers)._size = local_e8._24_8_;
        (this->text_pointers)._width = local_e8._32_8_;
        if ((void *)CONCAT71(local_e8._1_7_,local_e8[0]) != (void *)0x0) {
          operator_delete((void *)CONCAT71(local_e8._1_7_,local_e8[0]));
        }
      }
      this->log_sigma = (this->bwt_wt).log_sigma;
      __s = (pointer)operator_new(0x800);
      memset(__s,0,0x800);
      puVar3 = (this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      (this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = __s;
      (this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = __s + 0x100;
      (this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = __s + 0x100;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3);
        __s = (this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
      }
      __s[0xff] = 0;
      puVar18 = (uchar *)this->n;
      if (puVar18 != (uchar *)0x0) {
        local_ec = (this->bwt_wt).log_sigma;
        psVar5 = (this->bwt_wt).nodes.
                 super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar23 = (uchar *)0x0;
        do {
          if (puVar23 != (uchar *)this->terminator_position) {
            if (local_ec == 0) {
              uVar20 = 0;
            }
            else {
              lVar13 = 0;
              uVar20 = 0;
              puVar18 = puVar23;
              uVar21 = local_ec;
              do {
                uVar19 = (ulong)puVar18 >> 6;
                uVar6 = *(ulong *)(*(long *)&psVar5[lVar13].bitvector.
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data + uVar19 * 8);
                bVar22 = (byte)puVar18 & 0x3f;
                if ((uVar6 >> (bVar22 ^ 0x3f) & 1) == 0) {
                  if ((uchar *)psVar5[lVar13].n == puVar18) {
                    uVar15 = psVar5[lVar13].global_rank1;
                  }
                  else {
                    lVar14 = POPCOUNT(uVar6 >> ((ulong)(byte)-bVar22 & 0x3f));
                    if (((ulong)puVar18 & 0x3f) == 0) {
                      lVar14 = 0;
                    }
                    uVar15 = lVar14 + *(long *)(*(long *)&psVar5[lVar13].rank_ptrs_1.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data +
                                               ((ulong)puVar18 >> 0xc) * 8) +
                             (ulong)*(ushort *)
                                     (*(long *)&psVar5[lVar13].rank_ptrs_2.
                                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                ._M_impl.super__Vector_impl_data + uVar19 * 2);
                  }
                  puVar18 = puVar18 + -uVar15;
                  lVar13 = lVar13 * 2 + 1;
                }
                else {
                  if ((uchar *)psVar5[lVar13].n == puVar18) {
                    puVar18 = (uchar *)psVar5[lVar13].global_rank1;
                  }
                  else {
                    lVar14 = POPCOUNT(uVar6 >> ((ulong)(byte)-bVar22 & 0x3f));
                    if (((ulong)puVar18 & 0x3f) == 0) {
                      lVar14 = 0;
                    }
                    puVar18 = (uchar *)(lVar14 + *(long *)(*(long *)&psVar5[lVar13].rank_ptrs_1.
                                                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data +
                                                  ((ulong)puVar18 >> 0xc) * 8) +
                                       (ulong)*(ushort *)
                                               (*(long *)&psVar5[lVar13].rank_ptrs_2.
                                                                                                                    
                                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                  ._M_impl.super__Vector_impl_data + uVar19 * 2));
                  }
                  lVar13 = lVar13 * 2 + 2;
                }
                uVar21 = uVar21 - 1;
                uVar20 = (ulong)(((uint)(uVar6 >> (bVar22 ^ 0x3f)) & 1) + ((uint)uVar20 & 0xff) * 2)
                ;
              } while (uVar21 != 0);
              uVar20 = uVar20 & 0xff;
            }
            __s[uVar20] = __s[uVar20] + 1;
            puVar18 = (uchar *)this->n;
          }
          puVar23 = puVar23 + 1;
        } while (puVar23 < puVar18);
      }
      uVar16 = *__s;
      puVar1 = &(this->marked_positions).global_rank1;
      lVar13 = 1;
      do {
        uVar16 = uVar16 + __s[lVar13];
        __s[lVar13] = uVar16;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0xff);
      memmove(__s + 1,__s,0x7f0);
      uVar8 = local_f0;
      auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar25 = vpbroadcastq_avx512f(ZEXT816(0xff));
      auVar26 = vpternlogd_avx512f(auVar26,auVar26,auVar26,0xff);
      lVar13 = 0;
      *__s = 0;
      do {
        auVar27 = vpbroadcastq_avx512f();
        auVar27 = vporq_avx512f(auVar27,auVar24);
        uVar20 = vpcmpuq_avx512f(auVar27,auVar25,1);
        auVar27 = vmovdqu64_avx512f(*(undefined1 (*) [64])(__s + lVar13));
        auVar28._8_8_ = (ulong)((byte)(uVar20 >> 1) & 1) * auVar27._8_8_;
        auVar28._0_8_ = (ulong)((byte)uVar20 & 1) * auVar27._0_8_;
        auVar28._16_8_ = (ulong)((byte)(uVar20 >> 2) & 1) * auVar27._16_8_;
        auVar28._24_8_ = (ulong)((byte)(uVar20 >> 3) & 1) * auVar27._24_8_;
        auVar28._32_8_ = (ulong)((byte)(uVar20 >> 4) & 1) * auVar27._32_8_;
        auVar28._40_8_ = (ulong)((byte)(uVar20 >> 5) & 1) * auVar27._40_8_;
        auVar28._48_8_ = (ulong)((byte)(uVar20 >> 6) & 1) * auVar27._48_8_;
        auVar28._56_8_ = (uVar20 >> 7) * auVar27._56_8_;
        auVar27 = vpsubq_avx512f(auVar28,auVar26);
        auVar27 = vmovdqu64_avx512f(auVar27);
        *(undefined1 (*) [64])(__s + lVar13) = auVar27;
        lVar13 = lVar13 + 8;
      } while (lVar13 != 0x100);
      if (this->n != 0) {
        uVar20 = 0;
        do {
          if (BWT->_M_string_length <= uVar20) goto LAB_00104c5b;
          pcVar2 = (BWT->_M_dataplus)._M_p;
          pcVar2[uVar20] =
               (this->inverse_remapping).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start[(byte)pcVar2[uVar20]];
          uVar20 = uVar20 + 1;
        } while (uVar20 < this->n);
      }
      if (BWT->_M_string_length <= this->terminator_position) {
        uVar17 = std::__throw_out_of_range_fmt
                           ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
        if ((pointer)local_58._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_58._0_8_);
        }
        if (local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
          operator_delete(local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
          local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_offset = 0;
          local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset = 0;
        }
        if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (uchar *)0x0) {
          operator_delete(local_108.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        puVar23 = (this->inverse_remapping).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (puVar23 != (pointer)0x0) {
          operator_delete(puVar23);
        }
        puVar23 = (this->remapping).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (puVar23 != (pointer)0x0) {
          operator_delete(puVar23);
        }
        puVar3 = (this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (puVar3 != (pointer)0x0) {
          operator_delete(puVar3);
        }
        puVar3 = (this->text_pointers)._bits._container.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (puVar3 != (pointer)0x0) {
          operator_delete(puVar3);
        }
        succinct_bitvector::~succinct_bitvector(&this->marked_positions);
        std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::~vector
                  (&(this->bwt_wt).nodes);
        _Unwind_Resume(uVar17);
      }
      (BWT->_M_dataplus)._M_p[this->terminator_position] = '\0';
      if (local_60 != 0) {
        if (verbose) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\n  Marking positions containing a SA pointer ... ",0x31
                    );
        }
        markPositions((vector<bool,_std::allocator<bool>_> *)local_58,this,SUB41(uVar8,0));
        succinct_bitvector::succinct_bitvector
                  ((succinct_bitvector *)local_e8,(vector<bool,_std::allocator<bool>_> *)local_58);
        (this->marked_positions).n = CONCAT71(local_e8._1_7_,local_e8[0]);
        puVar3 = (this->marked_positions).bitvector.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (this->marked_positions).bitvector.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_e8._8_8_;
        (this->marked_positions).bitvector.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_e8._16_8_;
        (this->marked_positions).bitvector.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_e8._24_8_;
        local_e8._8_8_ = (pointer)0x0;
        local_e8._16_8_ = (pointer)0x0;
        local_e8._24_8_ = (pointer)0x0;
        if (puVar3 != (pointer)0x0) {
          operator_delete(puVar3);
        }
        puVar3 = (this->marked_positions).rank_ptrs_1.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (this->marked_positions).rank_ptrs_1.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_e8._32_8_;
        (this->marked_positions).rank_ptrs_1.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = puStack_c0;
        (this->marked_positions).rank_ptrs_1.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_b8;
        stack0xffffffffffffff38 = (undefined1  [16])0x0;
        local_b8 = (pointer)0x0;
        if (puVar3 != (pointer)0x0) {
          operator_delete(puVar3);
        }
        puVar4 = (this->marked_positions).rank_ptrs_2.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (this->marked_positions).rank_ptrs_2.
        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_b0._0_8_;
        (this->marked_positions).rank_ptrs_2.
        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_b0._8_8_;
        (this->marked_positions).rank_ptrs_2.
        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_a0;
        local_b0 = (undefined1  [16])0x0;
        local_a0 = (pointer)0x0;
        if (puVar4 == (pointer)0x0) {
          (this->marked_positions).local_rank1 = local_90;
          *puVar1 = local_98;
        }
        else {
          operator_delete(puVar4);
          (this->marked_positions).local_rank1 = local_90;
          *puVar1 = local_98;
          if ((pointer)local_b0._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_b0._0_8_);
          }
        }
        if ((pointer)local_e8._32_8_ != (pointer)0x0) {
          operator_delete((void *)local_e8._32_8_);
        }
        if ((pointer)local_e8._8_8_ != (pointer)0x0) {
          operator_delete((void *)local_e8._8_8_);
        }
        if (verbose) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Done.\n",8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\n  Sampling SA pointers ... ",0x1c);
        }
        sampleSA(this,SUB41(uVar8,0));
        if (verbose) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Done.\n",8);
        }
        if ((pointer)local_58._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_58._0_8_);
        }
      }
      if (local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      }
      if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  }
LAB_00104c8e:
  std::operator<<((ostream *)&std::cout,
                  "Error (IndexedBWT.cpp): the bwt contains no o more than one 0x0 bytes\n");
  exit(1);
LAB_00104c3f:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00104c4d:
  std::__throw_out_of_range_fmt
            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00104c5b:
  std::__throw_out_of_range_fmt
            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00104c6c:
  std::__throw_out_of_range_fmt
            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",puVar23);
LAB_00104c7d:
  std::__throw_out_of_range_fmt
            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",puVar23);
  goto LAB_00104c8e;
}

Assistant:

IndexedBWT(string &BWT, ulint sample_rate, bool verbose=false){

		this->n=BWT.length();
		this->offrate=sample_rate;

		number_of_SA_pointers = (sample_rate==0?0:n/sample_rate + 1);

		if(verbose) cout << " Building indexed BWT data structure" << endl;
		if(verbose) cout << "  Number of sampled SA pointers = " << number_of_SA_pointers << endl;

		w = ceil(log2(n));
		if(w<1) w=1;

		ulint nr_of_terminators=0;

		//compute re-mapping to keep alphabet size to a minimum
		//from text chars -> to integers in {0,...,sigma}. the 0x0 byte is also remapped in 0x0, as the first alphabet character.
		remapping = vector<uchar>(256,0);

		//detect alphabet
		vector<uchar> alphabet;
		vector<bool> char_inserted = vector<bool>(256,false);

		for(ulint i=0;i<n;i++){

			if((uchar)BWT.at(i)==0){//found terminator. Save position
				terminator_position = i;
				nr_of_terminators++;
			}else{

				if(not char_inserted.at((uchar)BWT.at(i))){

					alphabet.push_back((uchar)BWT.at(i));
					char_inserted.at((uchar)BWT.at(i))=true;

				}

			}
		}

		if(nr_of_terminators!=1){

			cout << "Error (IndexedBWT.cpp): the bwt contains no o more than one 0x0 bytes\n";
			exit(1);

		}

		sigma = alphabet.size();

		//sort alphabet

		std::sort(alphabet.begin(),alphabet.end());

		//calculate remapping
		//note: remapping of terminator (0x0) is 0

		for(uint i=0;i<alphabet.size();i++)
			remapping[alphabet.at(i)] = i;

		//calculate inverse remapping

		inverse_remapping = vector<uchar>(sigma);

		for(uint i=0;i<sigma;i++)
			inverse_remapping[i] = alphabet.at(i);

		//apply remapping

		for(ulint i=0;i<n;i++)
			BWT.at(i) = remapping[(uchar)BWT.at(i)];

		bwt_wt =  WaveletTree(BWT,verbose);

		marked_positions =  succinct_bitvector();

		text_pointers =  packed_view_t(w,number_of_SA_pointers);

		log_sigma = bwt_wt.bitsPerSymbol();

		FIRST = vector<ulint>(256,0);

		FIRST[TERMINATOR]=0;//first occurrence of terminator char in the first column is at the beginning

		//count number of occurrences of each character
		for(ulint i=0;i<n;i++)
			if(i!=terminator_position)
				FIRST[bwt_wt.charAt(i)]++;

		for(uint i=1;i<255;i++)
			FIRST[i] += FIRST[i-1];

		for(int i=254;i>0;i--)
			FIRST[i] = FIRST[i-1];

		FIRST[0] = 0;

		for(uint i=0;i<255;i++)
			FIRST[i]++;

		//restore original values in BWT
		for(ulint i=0;i<n;i++)
			BWT.at(i) = inverse_remapping[(uchar)BWT.at(i)];

		BWT.at(terminator_position) = 0;

		if(sample_rate>0){
			if(verbose) cout << "\n  Marking positions containing a SA pointer ... ";

			vector<bool> mark_pos = markPositions(verbose);
			marked_positions = succinct_bitvector( mark_pos );

			if(verbose) cout << "  Done.\n";

			if(verbose) cout << "\n  Sampling SA pointers ... ";
			sampleSA(verbose);
			if(verbose) cout << "  Done.\n";
		}

	}